

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_java_generator.cc
# Opt level: O0

void __thiscall
t_java_generator::generate_field_name_constants
          (t_java_generator *this,ostream *out,t_struct *tstruct)

{
  bool bVar1;
  bool bVar2;
  int32_t iVar3;
  ostream *poVar4;
  reference pptVar5;
  string *psVar6;
  string local_168;
  string local_148;
  string local_128;
  string local_108;
  string local_e8;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_c8;
  t_field **local_c0;
  string local_b8;
  string local_88;
  string local_68;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_48;
  t_field **local_40;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_38;
  const_iterator m_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> *members;
  bool first;
  t_struct *tstruct_local;
  ostream *out_local;
  t_java_generator *this_local;
  
  poVar4 = t_generator::indent((t_generator *)this,out);
  poVar4 = std::operator<<(poVar4,
                           "/** The set of fields this struct contains, along with convenience methods for finding and manipulating them. */"
                          );
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = t_generator::indent((t_generator *)this,out);
  poVar4 = std::operator<<(poVar4,"public enum _Fields implements org.apache.thrift.TFieldIdEnum {")
  ;
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_up((t_generator *)this);
  bVar2 = true;
  m_iter._M_current = (t_field **)t_struct::get_members(tstruct);
  __gnu_cxx::
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
  __normal_iterator(&local_38);
  local_40 = (t_field **)
             std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(m_iter._M_current);
  local_38._M_current = local_40;
  while( true ) {
    local_48._M_current =
         (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(m_iter._M_current);
    bVar1 = __gnu_cxx::operator!=(&local_38,&local_48);
    if (!bVar1) break;
    if (!bVar2) {
      poVar4 = std::operator<<(out,",");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    }
    bVar2 = false;
    pptVar5 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_38);
    (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x21])(this,out,*pptVar5);
    poVar4 = t_generator::indent((t_generator *)this,out);
    pptVar5 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_38);
    psVar6 = t_field::get_name_abi_cxx11_(*pptVar5);
    std::__cxx11::string::string((string *)&local_88,(string *)psVar6);
    constant_name(&local_68,this,&local_88);
    poVar4 = std::operator<<(poVar4,(string *)&local_68);
    poVar4 = std::operator<<(poVar4,"((short)");
    pptVar5 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_38);
    iVar3 = t_field::get_key(*pptVar5);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3);
    poVar4 = std::operator<<(poVar4,", \"");
    pptVar5 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_38);
    psVar6 = t_field::get_name_abi_cxx11_(*pptVar5);
    poVar4 = std::operator<<(poVar4,(string *)psVar6);
    std::operator<<(poVar4,"\")");
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_88);
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    operator++(&local_38);
  }
  poVar4 = std::operator<<(out,";");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = t_generator::indent((t_generator *)this,out);
  poVar4 = std::operator<<(poVar4,
                           "private static final java.util.Map<java.lang.String, _Fields> byName = new java.util.HashMap<java.lang.String, _Fields>();"
                          );
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::operator<<(out,(string *)&::endl_abi_cxx11_);
  poVar4 = t_generator::indent((t_generator *)this,out);
  poVar4 = std::operator<<(poVar4,"static {");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = t_generator::indent((t_generator *)this,out);
  poVar4 = std::operator<<(poVar4,"  for (_Fields field : java.util.EnumSet.allOf(_Fields.class)) {"
                          );
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = t_generator::indent((t_generator *)this,out);
  poVar4 = std::operator<<(poVar4,"    byName.put(field.getFieldName(), field);");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = t_generator::indent((t_generator *)this,out);
  poVar4 = std::operator<<(poVar4,"  }");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = t_generator::indent((t_generator *)this,out);
  poVar4 = std::operator<<(poVar4,"}");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = t_generator::indent((t_generator *)this,out);
  poVar4 = std::operator<<(poVar4,"/**");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = t_generator::indent((t_generator *)this,out);
  poVar4 = std::operator<<(poVar4,
                           " * Find the _Fields constant that matches fieldId, or null if its not found."
                          );
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = t_generator::indent((t_generator *)this,out);
  poVar4 = std::operator<<(poVar4," */");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = t_generator::indent((t_generator *)this,out);
  java_nullable_annotation_abi_cxx11_(&local_b8,this);
  poVar4 = std::operator<<(poVar4,(string *)&local_b8);
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_b8);
  poVar4 = t_generator::indent((t_generator *)this,out);
  poVar4 = std::operator<<(poVar4,"public static _Fields findByThriftId(int fieldId) {");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_up((t_generator *)this);
  poVar4 = t_generator::indent((t_generator *)this,out);
  poVar4 = std::operator<<(poVar4,"switch(fieldId) {");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_up((t_generator *)this);
  local_c0 = (t_field **)
             std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(m_iter._M_current);
  local_38._M_current = local_c0;
  while( true ) {
    local_c8._M_current =
         (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(m_iter._M_current);
    bVar2 = __gnu_cxx::operator!=(&local_38,&local_c8);
    if (!bVar2) break;
    poVar4 = t_generator::indent((t_generator *)this,out);
    poVar4 = std::operator<<(poVar4,"case ");
    pptVar5 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_38);
    iVar3 = t_field::get_key(*pptVar5);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3);
    poVar4 = std::operator<<(poVar4,": // ");
    pptVar5 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_38);
    psVar6 = t_field::get_name_abi_cxx11_(*pptVar5);
    std::__cxx11::string::string((string *)&local_108,(string *)psVar6);
    constant_name(&local_e8,this,&local_108);
    poVar4 = std::operator<<(poVar4,(string *)&local_e8);
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_108);
    poVar4 = t_generator::indent((t_generator *)this,out);
    poVar4 = std::operator<<(poVar4,"  return ");
    pptVar5 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_38);
    psVar6 = t_field::get_name_abi_cxx11_(*pptVar5);
    std::__cxx11::string::string((string *)&local_148,(string *)psVar6);
    constant_name(&local_128,this,&local_148);
    poVar4 = std::operator<<(poVar4,(string *)&local_128);
    poVar4 = std::operator<<(poVar4,";");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::~string((string *)&local_148);
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    operator++(&local_38);
  }
  poVar4 = t_generator::indent((t_generator *)this,out);
  poVar4 = std::operator<<(poVar4,"default:");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = t_generator::indent((t_generator *)this,out);
  poVar4 = std::operator<<(poVar4,"  return null;");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_down((t_generator *)this);
  poVar4 = t_generator::indent((t_generator *)this,out);
  poVar4 = std::operator<<(poVar4,"}");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_down((t_generator *)this);
  poVar4 = t_generator::indent((t_generator *)this,out);
  poVar4 = std::operator<<(poVar4,"}");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = t_generator::indent((t_generator *)this,out);
  poVar4 = std::operator<<(poVar4,"/**");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = t_generator::indent((t_generator *)this,out);
  poVar4 = std::operator<<(poVar4,
                           " * Find the _Fields constant that matches fieldId, throwing an exception"
                          );
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = t_generator::indent((t_generator *)this,out);
  poVar4 = std::operator<<(poVar4," * if it is not found.");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = t_generator::indent((t_generator *)this,out);
  poVar4 = std::operator<<(poVar4," */");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = t_generator::indent((t_generator *)this,out);
  poVar4 = std::operator<<(poVar4,"public static _Fields findByThriftIdOrThrow(int fieldId) {");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = t_generator::indent((t_generator *)this,out);
  poVar4 = std::operator<<(poVar4,"  _Fields fields = findByThriftId(fieldId);");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = t_generator::indent((t_generator *)this,out);
  poVar4 = std::operator<<(poVar4,
                           "  if (fields == null) throw new java.lang.IllegalArgumentException(\"Field \" + fieldId + \" doesn\'t exist!\");"
                          );
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = t_generator::indent((t_generator *)this,out);
  poVar4 = std::operator<<(poVar4,"  return fields;");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = t_generator::indent((t_generator *)this,out);
  poVar4 = std::operator<<(poVar4,"}");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = t_generator::indent((t_generator *)this,out);
  poVar4 = std::operator<<(poVar4,"/**");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = t_generator::indent((t_generator *)this,out);
  poVar4 = std::operator<<(poVar4,
                           " * Find the _Fields constant that matches name, or null if its not found."
                          );
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = t_generator::indent((t_generator *)this,out);
  poVar4 = std::operator<<(poVar4," */");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = t_generator::indent((t_generator *)this,out);
  java_nullable_annotation_abi_cxx11_(&local_168,this);
  poVar4 = std::operator<<(poVar4,(string *)&local_168);
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_168);
  poVar4 = t_generator::indent((t_generator *)this,out);
  poVar4 = std::operator<<(poVar4,"public static _Fields findByName(java.lang.String name) {");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = t_generator::indent((t_generator *)this,out);
  poVar4 = std::operator<<(poVar4,"  return byName.get(name);");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = t_generator::indent((t_generator *)this,out);
  poVar4 = std::operator<<(poVar4,"}");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = t_generator::indent((t_generator *)this,out);
  poVar4 = std::operator<<(poVar4,"private final short _thriftId;");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = t_generator::indent((t_generator *)this,out);
  poVar4 = std::operator<<(poVar4,"private final java.lang.String _fieldName;");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = t_generator::indent((t_generator *)this,out);
  poVar4 = std::operator<<(poVar4,"_Fields(short thriftId, java.lang.String fieldName) {");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = t_generator::indent((t_generator *)this,out);
  poVar4 = std::operator<<(poVar4,"  _thriftId = thriftId;");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = t_generator::indent((t_generator *)this,out);
  poVar4 = std::operator<<(poVar4,"  _fieldName = fieldName;");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = t_generator::indent((t_generator *)this,out);
  poVar4 = std::operator<<(poVar4,"}");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = t_generator::indent((t_generator *)this,out);
  poVar4 = std::operator<<(poVar4,"public short getThriftFieldId() {");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = t_generator::indent((t_generator *)this,out);
  poVar4 = std::operator<<(poVar4,"  return _thriftId;");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = t_generator::indent((t_generator *)this,out);
  poVar4 = std::operator<<(poVar4,"}");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = t_generator::indent((t_generator *)this,out);
  poVar4 = std::operator<<(poVar4,"public java.lang.String getFieldName() {");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = t_generator::indent((t_generator *)this,out);
  poVar4 = std::operator<<(poVar4,"  return _fieldName;");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = t_generator::indent((t_generator *)this,out);
  poVar4 = std::operator<<(poVar4,"}");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_down((t_generator *)this);
  poVar4 = t_generator::indent((t_generator *)this,out);
  poVar4 = std::operator<<(poVar4,"}");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  return;
}

Assistant:

void t_java_generator::generate_field_name_constants(ostream& out, t_struct* tstruct) {
  indent(out) << "/** The set of fields this struct contains, along with convenience methods for "
                 "finding and manipulating them. */" << endl;
  indent(out) << "public enum _Fields implements org.apache.thrift.TFieldIdEnum {" << endl;

  indent_up();
  bool first = true;
  const vector<t_field*>& members = tstruct->get_members();
  vector<t_field*>::const_iterator m_iter;
  for (m_iter = members.begin(); m_iter != members.end(); ++m_iter) {
    if (!first) {
      out << "," << endl;
    }
    first = false;
    generate_java_doc(out, *m_iter);
    indent(out) << constant_name((*m_iter)->get_name()) << "((short)" << (*m_iter)->get_key()
                << ", \"" << (*m_iter)->get_name() << "\")";
  }

  out << ";" << endl << endl;

  indent(out)
      << "private static final java.util.Map<java.lang.String, _Fields> byName = new java.util.HashMap<java.lang.String, _Fields>();"
      << endl;
  out << endl;

  indent(out) << "static {" << endl;
  indent(out) << "  for (_Fields field : java.util.EnumSet.allOf(_Fields.class)) {" << endl;
  indent(out) << "    byName.put(field.getFieldName(), field);" << endl;
  indent(out) << "  }" << endl;
  indent(out) << "}" << endl << endl;

  indent(out) << "/**" << endl;
  indent(out) << " * Find the _Fields constant that matches fieldId, or null if its not found."
              << endl;
  indent(out) << " */" << endl;
  indent(out) << java_nullable_annotation() << endl;
  indent(out) << "public static _Fields findByThriftId(int fieldId) {" << endl;
  indent_up();
  indent(out) << "switch(fieldId) {" << endl;
  indent_up();

  for (m_iter = members.begin(); m_iter != members.end(); ++m_iter) {
    indent(out) << "case " << (*m_iter)->get_key() << ": // "
                << constant_name((*m_iter)->get_name()) << endl;
    indent(out) << "  return " << constant_name((*m_iter)->get_name()) << ";" << endl;
  }

  indent(out) << "default:" << endl;
  indent(out) << "  return null;" << endl;

  indent_down();
  indent(out) << "}" << endl;

  indent_down();
  indent(out) << "}" << endl << endl;

  indent(out) << "/**" << endl;
  indent(out) << " * Find the _Fields constant that matches fieldId, throwing an exception" << endl;
  indent(out) << " * if it is not found." << endl;
  indent(out) << " */" << endl;
  indent(out) << "public static _Fields findByThriftIdOrThrow(int fieldId) {" << endl;
  indent(out) << "  _Fields fields = findByThriftId(fieldId);" << endl;
  indent(out) << "  if (fields == null) throw new java.lang.IllegalArgumentException(\"Field \" + fieldId + "
                 "\" doesn't exist!\");" << endl;
  indent(out) << "  return fields;" << endl;
  indent(out) << "}" << endl << endl;

  indent(out) << "/**" << endl;
  indent(out) << " * Find the _Fields constant that matches name, or null if its not found."
              << endl;
  indent(out) << " */" << endl;
  indent(out) << java_nullable_annotation() << endl;
  indent(out) << "public static _Fields findByName(java.lang.String name) {" << endl;
  indent(out) << "  return byName.get(name);" << endl;
  indent(out) << "}" << endl << endl;

  indent(out) << "private final short _thriftId;" << endl;
  indent(out) << "private final java.lang.String _fieldName;" << endl << endl;

  indent(out) << "_Fields(short thriftId, java.lang.String fieldName) {" << endl;
  indent(out) << "  _thriftId = thriftId;" << endl;
  indent(out) << "  _fieldName = fieldName;" << endl;
  indent(out) << "}" << endl << endl;

  indent(out) << "public short getThriftFieldId() {" << endl;
  indent(out) << "  return _thriftId;" << endl;
  indent(out) << "}" << endl << endl;

  indent(out) << "public java.lang.String getFieldName() {" << endl;
  indent(out) << "  return _fieldName;" << endl;
  indent(out) << "}" << endl;

  indent_down();

  indent(out) << "}" << endl;
}